

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseAllSavepoints(Pager *pPager)

{
  int iVar1;
  int local_14;
  int ii;
  Pager *pPager_local;
  
  for (local_14 = 0; local_14 < pPager->nSavepoint; local_14 = local_14 + 1) {
    sqlite3BitvecDestroy(pPager->aSavepoint[local_14].pInSavepoint);
  }
  if (pPager->exclusiveMode != '\0') {
    iVar1 = sqlite3JournalIsInMemory(pPager->sjfd);
    if (iVar1 == 0) goto LAB_00146b22;
  }
  sqlite3OsClose(pPager->sjfd);
LAB_00146b22:
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = (PagerSavepoint *)0x0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
  return;
}

Assistant:

static void releaseAllSavepoints(Pager *pPager){
  int ii;               /* Iterator for looping through Pager.aSavepoint */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
  }
  if( !pPager->exclusiveMode || sqlite3JournalIsInMemory(pPager->sjfd) ){
    sqlite3OsClose(pPager->sjfd);
  }
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = 0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
}